

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOperator.cpp
# Opt level: O3

void __thiscall
adios2::plugin::EncryptionOperator::EncryptionOperator(EncryptionOperator *this,Params *parameters)

{
  unique_ptr<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
  *puVar1;
  int iVar2;
  EncryptImpl *pEVar3;
  iterator iVar4;
  runtime_error *this_00;
  key_type local_40;
  
  adios2::plugin::PluginOperatorInterface::PluginOperatorInterface
            (&this->super_PluginOperatorInterface,(map *)parameters);
  *(undefined ***)this = &PTR__EncryptionOperator_00105ca8;
  pEVar3 = (EncryptImpl *)operator_new(0x48);
  puVar1 = &this->Impl;
  (pEVar3->KeyFilename)._M_dataplus = (_Alloc_hider)&(pEVar3->KeyFilename).field_2;
  (pEVar3->KeyFilename)._M_string_length = 0;
  (pEVar3->KeyFilename).field_2._M_local_buf[0] = '\0';
  pEVar3->Key[0] = '\0';
  pEVar3->Key[1] = '\0';
  pEVar3->Key[2] = '\0';
  pEVar3->Key[3] = '\0';
  pEVar3->Key[4] = '\0';
  pEVar3->Key[5] = '\0';
  pEVar3->Key[6] = '\0';
  pEVar3->Key[7] = '\0';
  pEVar3->Key[8] = '\0';
  pEVar3->Key[9] = '\0';
  pEVar3->Key[10] = '\0';
  pEVar3->Key[0xb] = '\0';
  pEVar3->Key[0xc] = '\0';
  pEVar3->Key[0xd] = '\0';
  pEVar3->Key[0xe] = '\0';
  pEVar3->Key[0xf] = '\0';
  pEVar3->Key[0x10] = '\0';
  pEVar3->Key[0x11] = '\0';
  pEVar3->Key[0x12] = '\0';
  pEVar3->Key[0x13] = '\0';
  pEVar3->Key[0x14] = '\0';
  pEVar3->Key[0x15] = '\0';
  pEVar3->Key[0x16] = '\0';
  pEVar3->Key[0x17] = '\0';
  pEVar3->Key[0x18] = '\0';
  pEVar3->Key[0x19] = '\0';
  pEVar3->Key[0x1a] = '\0';
  pEVar3->Key[0x1b] = '\0';
  pEVar3->Key[0x1c] = '\0';
  pEVar3->Key[0x1d] = '\0';
  pEVar3->Key[0x1e] = '\0';
  pEVar3->Key[0x1f] = '\0';
  pEVar3->KeyValid = false;
  (puVar1->_M_t).
  super___uniq_ptr_impl<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::plugin::EncryptionOperator::EncryptImpl_*,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
  .super__Head_base<0UL,_adios2::plugin::EncryptionOperator::EncryptImpl_*,_false>._M_head_impl =
       pEVar3;
  iVar2 = sodium_init();
  if (-1 < iVar2) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"secretkeyfile","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&this->field_0x50,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (iVar4._M_node != (_Base_ptr)&this->field_0x58) {
      std::__cxx11::string::_M_assign
                ((string *)
                 (puVar1->_M_t).
                 super___uniq_ptr_impl<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_adios2::plugin::EncryptionOperator::EncryptImpl_*,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
                 .super__Head_base<0UL,_adios2::plugin::EncryptionOperator::EncryptImpl_*,_false>.
                 _M_head_impl);
      EncryptImpl::GenerateOrReadKey
                ((puVar1->_M_t).
                 super___uniq_ptr_impl<adios2::plugin::EncryptionOperator::EncryptImpl,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_adios2::plugin::EncryptionOperator::EncryptImpl_*,_std::default_delete<adios2::plugin::EncryptionOperator::EncryptImpl>_>
                 .super__Head_base<0UL,_adios2::plugin::EncryptionOperator::EncryptImpl_*,_false>.
                 _M_head_impl);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"libsodium could not be initialized");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EncryptionOperator::EncryptionOperator(const Params &parameters)
: PluginOperatorInterface(parameters), Impl(new EncryptImpl)
{
    if (sodium_init() < 0)
    {
        throw std::runtime_error("libsodium could not be initialized");
    }

    // in the case "secretkeyfile" is found, so we know the operator should
    // calling Operate(). If "secretkeyfile" is not found, then the operator
    // should be calling InverseOperate(), due to ADIOS calling InverseOperate()
    // not allowing Parameters to be passed.
    auto skFileIt = m_Parameters.find("secretkeyfile");
    if (skFileIt != m_Parameters.end())
    {
        Impl->KeyFilename = skFileIt->second;
        Impl->GenerateOrReadKey();
    }
}